

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvt2triphone.c
# Opt level: O2

int cvt2triphone(acmod_set_t *acmod_set,acmod_id_t *phone,char *btw_mark,uint32 n_phone)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  acmod_id_t aVar4;
  uint32 uVar5;
  uint32 uVar6;
  acmod_id_t aVar7;
  acmod_id_t aVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  uint phone_00;
  uint uVar12;
  ulong uVar13;
  word_posn_t wVar14;
  ulong uVar15;
  word_posn_t local_60;
  
  aVar4 = acmod_set_name2id(acmod_set,"SIL");
  uVar5 = acmod_set_n_multi(acmod_set);
  if (uVar5 == 0) {
    if (cvt2triphone_spoke_my_peace == '\0') {
      fflush(_stdout);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
              ,199,"no multiphones defined, no conversion done\n");
      cvt2triphone_spoke_my_peace = '\x01';
      fflush(_stderr);
    }
  }
  else {
    uVar13 = (ulong)(n_phone - 1);
    local_60 = WORD_POSN_END;
    uVar1 = 0;
    aVar8 = aVar4;
LAB_00125f1b:
    uVar12 = aVar8;
    uVar15 = uVar1;
    if (uVar15 != uVar13) {
      uVar1 = uVar15 + 1;
      uVar3 = phone[uVar15 + 1];
      uVar5 = acmod_set_has_attrib(acmod_set,uVar3 & 0xff,"filler");
      bVar2 = (byte)phone[uVar15];
      phone_00 = (uint)bVar2;
      local_60 = btw_posn(btw_mark[uVar15],local_60);
      uVar6 = acmod_set_has_attrib(acmod_set,(uint)bVar2,"filler");
      aVar8 = aVar4;
      if (uVar6 == 0) {
        if (uVar5 != 0) {
          uVar3 = aVar4;
        }
        uVar12 = uVar12 & 0xff;
        aVar7 = acmod_set_tri2id(acmod_set,(uint)bVar2,uVar12,uVar3 & 0xff,local_60);
        aVar8 = phone_00;
        if (aVar7 == 0xffffffff) {
          wVar14 = WORD_POSN_BEGIN;
          do {
            if (wVar14 == WORD_POSN_UNDEFINED) goto LAB_00125f1b;
            aVar7 = acmod_set_tri2id(acmod_set,phone_00,uVar12,uVar3 & 0xff,wVar14);
            wVar14 = wVar14 + WORD_POSN_END;
          } while (aVar7 == 0xffffffff);
        }
        phone[uVar15] = aVar7;
      }
      goto LAB_00125f1b;
    }
    bVar2 = (byte)phone[uVar13];
    uVar5 = acmod_set_has_attrib(acmod_set,(uint)bVar2,"filler");
    if (uVar5 == 0) {
      if (uVar13 != 0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                ,0x10b,"utt does not end with filler phone\n");
      }
      if (btw_mark[uVar13] == '\0') {
        __assert_fail("btw_mark[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                      ,0x110,"int cvt2triphone(acmod_set_t *, acmod_id_t *, char *, uint32)");
      }
      wVar14 = btw_posn(btw_mark[uVar13],local_60);
      uVar12 = uVar12 & 0xff;
      aVar8 = acmod_set_tri2id(acmod_set,(uint)bVar2,uVar12,aVar4 & 0xff,wVar14);
      if (aVar8 == 0xffffffff) {
        pcVar9 = acmod_set_id2name(acmod_set,(uint)bVar2);
        pcVar10 = acmod_set_id2name(acmod_set,uVar12);
        pcVar11 = acmod_set_id2name(acmod_set,aVar4 & 0xff);
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                ,0x11d,"Missing triphone, (%s %s %s %c), left as CI phone",pcVar9,pcVar10,pcVar11,
                (ulong)(uint)(int)"besiu"[wVar14]);
      }
      else {
        phone[uVar13] = aVar8;
      }
    }
  }
  return 0;
}

Assistant:

int
cvt2triphone(acmod_set_t *acmod_set,
	     acmod_id_t *phone,
	     char *btw_mark,
	     uint32 n_phone)
{
    uint32 i;
    ci_acmod_id_t b = (ci_acmod_id_t)NO_ACMOD;
    ci_acmod_id_t l = (ci_acmod_id_t)NO_ACMOD;
    ci_acmod_id_t r = (ci_acmod_id_t)NO_ACMOD;
    acmod_id_t tri_id;
    word_posn_t posn;
    static int spoke_my_peace = FALSE;
    acmod_id_t sil = acmod_set_name2id(acmod_set, "SIL");
    char *word_posn_map = WORD_POSN_CHAR_MAP;

    if (acmod_set_n_multi(acmod_set) == 0) {
	/* nothing to do */

	if (!spoke_my_peace) {
	    fflush(stdout);
	    E_INFO("no multiphones defined, no conversion done\n");
	    spoke_my_peace = TRUE;
	    fflush(stderr);
	}
	return S3_SUCCESS;
    }

    for (i = 0, l = r = sil, posn = WORD_POSN_END; i < n_phone-1; i++) {
	/* get new right context */
	r = phone[i+1];
	if (acmod_set_has_attrib(acmod_set, r, "filler"))
	    r = sil;
	
	b = phone[i];

	/* determine between word position {begin|start|single} */
	posn = btw_posn(btw_mark[i], posn);
	
	if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
	    tri_id = acmod_set_tri2id(acmod_set,
				      b, l, r, posn);
	    if (tri_id != NO_ACMOD) {
		/* got good triphone, so replace CI w/ tri */
		phone[i] = tri_id;
	    }
	    else {
		    /* Try to back off to other word positions */
		    int j;

		    for (j = 0; j < N_WORD_POSN; ++j) {
			    tri_id = acmod_set_tri2id(acmod_set,
						      b, l, r, j);
			    if (tri_id != NO_ACMOD) {
				    phone[i] = tri_id;
				    break;
			    }
		    }
		    if (j == N_WORD_POSN) {
#if 0
			    E_WARN("Missing triphone, (%s %s %s %c), left as CI phone\n",
				   acmod_set_id2name(acmod_set, b),
				   acmod_set_id2name(acmod_set, l),
				   acmod_set_id2name(acmod_set, r),
				   word_posn_map[(int)posn]);
#endif
		    }
	    }
	}
	else {
	    /* phone[i] is a filler phone, so just leave it as is */
	    /* Change b to SIL for triphone context purposes */
	    b = sil;
	}

	/* Set next left context is the current base phone (where filler phones
	 * are mapped to SIL) */
	l = b;
    }

    b = phone[i];
    r = sil;

    /* At this point, b is the right context of
     * the next to last phone.  Typically, this
     * is sil or some other filler phone. */

    if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
	if (i > 0) {
	    E_WARN("utt does not end with filler phone\n");

	    r = sil;
	}
	
	assert( btw_mark[i] );
	
	posn = btw_posn(btw_mark[i], posn);
	
	tri_id = acmod_set_tri2id(acmod_set,
				  b, l, r, posn);
	if (tri_id != NO_ACMOD)
	    phone[i] = tri_id;
	else {
	    E_WARN("Missing triphone, (%s %s %s %c), left as CI phone",
		   acmod_set_id2name(acmod_set, b),
		   acmod_set_id2name(acmod_set, l),
		   acmod_set_id2name(acmod_set, r),
		   word_posn_map[(int)posn]);
	}
    }

    return S3_SUCCESS;
}